

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple16.h
# Opt level: O3

bool FastPForLib::Simple16<false>::tryme<1u,4u,8u,3u>(uint32_t *n,size_t len)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  
  if ((len == 0) || (*n < 0x10)) {
    uVar2 = len - (len != 0);
    if (uVar2 == 0) {
      return true;
    }
    uVar1 = 8;
    if (uVar2 < 8) {
      uVar1 = uVar2;
    }
    uVar2 = 2 - (ulong)(len == 0);
    do {
      bVar3 = n[uVar2 - 1] < 8;
      if (!bVar3) {
        return bVar3;
      }
      bVar4 = uVar2 < uVar1 + (len != 0);
      uVar2 = uVar2 + 1;
    } while (bVar4);
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

static bool tryme(const uint32_t *n, size_t len) {
    const uint32_t min1 = (len < num1) ? static_cast<uint32_t>(len) : num1;
    for (uint32_t i = 0; i < min1; i++) {
      if ((n[i]) >= (1U << log1))
        return false;
    }
    const uint32_t min2 =
        (len - min1 < num2) ? static_cast<uint32_t>(len - min1) : num2;
    for (uint32_t i = min1; i < min1 + min2; i++) {
      if ((n[i]) >= (1U << log2))
        return false;
    }
    return true;
  }